

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O0

void __thiscall
irr::video::COpenGLMaterialRenderer_ONETEXTURE_BLEND::OnSetMaterial
          (COpenGLMaterialRenderer_ONETEXTURE_BLEND *this,SMaterial *material,
          SMaterial *lastMaterial,bool resetAllRenderstates,IMaterialRendererServices *services)

{
  bool bVar1;
  E_OPENGL_FIXED_PIPELINE_STATE EVar2;
  GLenum source;
  ulong uVar3;
  COpenGLCacheHandler *this_00;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  u32 alphaSource;
  E_MODULATE_FUNC modulate;
  E_BLEND_FACTOR dstAlphaFact;
  E_BLEND_FACTOR srcAlphaFact;
  E_BLEND_FACTOR dstRGBFact;
  E_BLEND_FACTOR srcRGBFact;
  undefined4 in_stack_ffffffffffffff88;
  GLenum in_stack_ffffffffffffff8c;
  undefined4 uVar4;
  COpenGLCacheHandler *in_stack_ffffffffffffff90;
  GLenum in_stack_ffffffffffffff98;
  GLenum in_stack_ffffffffffffff9c;
  COpenGLDriver *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_40;
  uint local_3c;
  E_BLEND_FACTOR local_38;
  E_BLEND_FACTOR local_34;
  E_BLEND_FACTOR local_30;
  E_BLEND_FACTOR local_2c;
  
  EVar2 = COpenGLDriver::getFixedPipelineState(*(COpenGLDriver **)(in_RDI + 8));
  if (EVar2 == EOFPS_DISABLE) {
    COpenGLDriver::setFixedPipelineState(*(COpenGLDriver **)(in_RDI + 8),EOFPS_DISABLE_TO_ENABLE);
  }
  else {
    COpenGLDriver::setFixedPipelineState(*(COpenGLDriver **)(in_RDI + 8),EOFPS_ENABLE);
  }
  COpenGLDriver::disableTextures(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  (**(code **)(**(long **)(in_RDI + 8) + 0x3c0))(*(long **)(in_RDI + 8),in_RSI,in_RDX,in_CL & 1);
  unpack_textureBlendFuncSeparate
            ((E_BLEND_FACTOR *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (E_BLEND_FACTOR *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (E_BLEND_FACTOR *)in_stack_ffffffffffffffa0,
             (E_BLEND_FACTOR *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (E_MODULATE_FUNC *)in_stack_ffffffffffffff90,
             (u32 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0.0);
  COpenGLDriver::getCacheHandler(*(COpenGLDriver **)(in_RDI + 8));
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setBlend(&in_stack_ffffffffffffff90->
              super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ,SUB41(in_stack_ffffffffffffff8c >> 0x18,0));
  uVar3 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),0x22);
  if ((uVar3 & 1) == 0) {
    in_stack_ffffffffffffff90 = COpenGLDriver::getCacheHandler(*(COpenGLDriver **)(in_RDI + 8));
    source = COpenGLDriver::getGLBlend(*(COpenGLDriver **)(in_RDI + 8),local_2c);
    COpenGLDriver::getGLBlend(*(COpenGLDriver **)(in_RDI + 8),local_30);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlendFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)in_stack_ffffffffffffffa0,source,in_stack_ffffffffffffff98);
  }
  else {
    this_00 = COpenGLDriver::getCacheHandler(*(COpenGLDriver **)(in_RDI + 8));
    COpenGLDriver::getGLBlend(*(COpenGLDriver **)(in_RDI + 8),local_2c);
    COpenGLDriver::getGLBlend(*(COpenGLDriver **)(in_RDI + 8),local_30);
    COpenGLDriver::getGLBlend(*(COpenGLDriver **)(in_RDI + 8),local_34);
    COpenGLDriver::getGLBlend(*(COpenGLDriver **)(in_RDI + 8),local_38);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlendFuncSeparate
              (&this_00->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
               (GLenum)((ulong)in_stack_ffffffffffffff90 >> 0x20),(GLenum)in_stack_ffffffffffffff90)
    ;
  }
  COpenGLDriver::getCacheHandler(*(COpenGLDriver **)(in_RDI + 8));
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setActiveTexture(&in_stack_ffffffffffffff90->
                      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ,in_stack_ffffffffffffff8c);
  uVar4 = 0x2300;
  glTexEnvi(0x2300,0x2200,0x8570);
  glTexEnvi(uVar4,0x8571,0x2100);
  glTexEnvi(uVar4,0x8580,0x1702);
  glTexEnvi(uVar4,0x8581,0x8578);
  glTexEnvf((float)local_3c,0x2300,0x8573);
  bVar1 = textureBlendFunc_hasAlpha(local_2c);
  if ((((bVar1) || (bVar1 = textureBlendFunc_hasAlpha(local_30), bVar1)) ||
      (bVar1 = textureBlendFunc_hasAlpha(local_34), bVar1)) ||
     (bVar1 = textureBlendFunc_hasAlpha(local_38), bVar1)) {
    if (local_40 == 1) {
      glTexEnvi(0x2300,0x8572,0x1e01);
      glTexEnvi(0x2300,0x8588,0x8577);
    }
    else if (local_40 == 2) {
      glTexEnvi(0x2300,0x8572,0x1e01);
      glTexEnvi(0x2300,0x8588,0x1702);
    }
    else {
      glTexEnvi(0x2300,0x8572,0x2100);
      glTexEnvi(0x2300,0x8588,0x8577);
      glTexEnvi(0x2300,0x8589,0x1702);
    }
  }
  return;
}

Assistant:

virtual void OnSetMaterial(const SMaterial &material, const SMaterial &lastMaterial,
			bool resetAllRenderstates, IMaterialRendererServices *services) override
	{
		if (Driver->getFixedPipelineState() == COpenGLDriver::EOFPS_DISABLE)
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_DISABLE_TO_ENABLE);
		else
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_ENABLE);

		Driver->disableTextures(1);
		Driver->setBasicRenderStates(material, lastMaterial, resetAllRenderstates);

		//		if (material.MaterialType != lastMaterial.MaterialType ||
		//			material.MaterialTypeParam != lastMaterial.MaterialTypeParam ||
		//			resetAllRenderstates)
		{
			E_BLEND_FACTOR srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact;
			E_MODULATE_FUNC modulate;
			u32 alphaSource;
			unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulate, alphaSource, material.MaterialTypeParam);

			Driver->getCacheHandler()->setBlend(true);

			if (Driver->queryFeature(EVDF_BLEND_SEPARATE)) {
				Driver->getCacheHandler()->setBlendFuncSeparate(Driver->getGLBlend(srcRGBFact), Driver->getGLBlend(dstRGBFact),
						Driver->getGLBlend(srcAlphaFact), Driver->getGLBlend(dstAlphaFact));
			} else {
				Driver->getCacheHandler()->setBlendFunc(Driver->getGLBlend(srcRGBFact), Driver->getGLBlend(dstRGBFact));
			}

			Driver->getCacheHandler()->setActiveTexture(GL_TEXTURE0_ARB);

#ifdef GL_ARB_texture_env_combine
			glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE_ARB);
			glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB_ARB, GL_MODULATE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB_ARB, GL_TEXTURE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_ARB, GL_PREVIOUS_ARB);
			glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_ARB, (f32)modulate);
#else
			glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE_EXT);
			glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB_EXT, GL_MODULATE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB_EXT, GL_TEXTURE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_EXT, GL_PREVIOUS_EXT);
			glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_EXT, (f32)modulate);
#endif

			if (textureBlendFunc_hasAlpha(srcRGBFact) || textureBlendFunc_hasAlpha(dstRGBFact) ||
					textureBlendFunc_hasAlpha(srcAlphaFact) || textureBlendFunc_hasAlpha(dstAlphaFact)) {
				if (alphaSource == EAS_VERTEX_COLOR) {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_PRIMARY_COLOR_ARB);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_PRIMARY_COLOR_EXT);
#endif
				} else if (alphaSource == EAS_TEXTURE) {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_TEXTURE);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_TEXTURE);
#endif
				} else {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_MODULATE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_PRIMARY_COLOR_ARB);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA_ARB, GL_TEXTURE);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_MODULATE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_PRIMARY_COLOR_EXT);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA_EXT, GL_TEXTURE);
#endif
				}
			}
		}
	}